

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int sizes [17];
  int next_code [16];
  int aiStack_28 [2];
  
  sizes[0x10] = 0;
  uVar11 = 0;
  sizes._0_64_ = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  memset(z,0,0x400);
  uVar5 = (ulong)(uint)(~(num >> 0x1f) & num);
  for (; uVar5 != uVar11; uVar11 = uVar11 + 1) {
    sizes[sizelist[uVar11]] = sizes[sizelist[uVar11]] + 1;
  }
  lVar9 = 1;
  while (lVar9 != 0x10) {
    uVar8 = (uint)lVar9;
    piVar1 = sizes + lVar9;
    lVar9 = lVar9 + 1;
    if (1 << (uVar8 & 0x1f) < *piVar1) {
      stbi__g_failure_reason = "bad sizes";
      return 0;
    }
  }
  iVar6 = 0;
  uVar8 = 0xf;
  lVar9 = -0xf;
  iVar10 = 0;
  while( true ) {
    if (lVar9 == 0) {
      uVar11 = 0;
      z->maxcode[0x10] = 0x10000;
      do {
        if (uVar11 == uVar5) {
          return 1;
        }
        bVar2 = sizelist[uVar11];
        if (bVar2 != 0) {
          iVar6 = next_code[bVar2];
          lVar9 = (long)(int)(iVar6 - (uint)z->firstcode[bVar2]) + (ulong)z->firstsymbol[bVar2];
          z->size[lVar9] = bVar2;
          z->value[lVar9] = (stbi__uint16)uVar11;
          if (bVar2 < 10) {
            halt_baddata();
          }
          next_code[bVar2] = iVar6 + 1;
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
    aiStack_28[lVar9] = iVar6;
    *(short *)((long)z->maxcode + lVar9 * 2) = (short)iVar6;
    *(short *)(z->size + lVar9 * 2) = (short)iVar10;
    iVar3 = sizes[lVar9 + 0x10];
    iVar7 = iVar6 + iVar3;
    if ((iVar3 != 0) && (1 << ((int)lVar9 + 0x10U & 0x1f) < iVar7)) break;
    uVar4 = uVar8 & 0x1f;
    iVar6 = iVar7 * 2;
    iVar10 = iVar10 + iVar3;
    uVar8 = uVar8 - 1;
    z->maxcode[lVar9 + 0x10] = iVar7 << uVar4;
    lVar9 = lVar9 + 1;
  }
  stbi__g_failure_reason = "bad codelengths";
  return 0;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
   int i,k=0;
   int code, next_code[16], sizes[17];

   // DEFLATE spec for generating codes
   memset(sizes, 0, sizeof(sizes));
   memset(z->fast, 0, sizeof(z->fast));
   for (i=0; i < num; ++i)
      ++sizes[sizelist[i]];
   sizes[0] = 0;
   for (i=1; i < 16; ++i)
      if (sizes[i] > (1 << i))
         return stbi__err("bad sizes", "Corrupt PNG");
   code = 0;
   for (i=1; i < 16; ++i) {
      next_code[i] = code;
      z->firstcode[i] = (stbi__uint16) code;
      z->firstsymbol[i] = (stbi__uint16) k;
      code = (code + sizes[i]);
      if (sizes[i])
         if (code-1 >= (1 << i)) return stbi__err("bad codelengths","Corrupt PNG");
      z->maxcode[i] = code << (16-i); // preshift for inner loop
      code <<= 1;
      k += sizes[i];
   }
   z->maxcode[16] = 0x10000; // sentinel
   for (i=0; i < num; ++i) {
      int s = sizelist[i];
      if (s) {
         int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
         stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
         z->size [c] = (stbi_uc     ) s;
         z->value[c] = (stbi__uint16) i;
         if (s <= STBI__ZFAST_BITS) {
            int j = stbi__bit_reverse(next_code[s],s);
            while (j < (1 << STBI__ZFAST_BITS)) {
               z->fast[j] = fastv;
               j += (1 << s);
            }
         }
         ++next_code[s];
      }
   }
   return 1;
}